

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O0

void __thiscall QdfFixer::writeBinary(QdfFixer *this,unsigned_long_long val,size_t bytes)

{
  logic_error *this_00;
  undefined1 *puVar1;
  size_t local_60;
  size_t i;
  string local_50 [8];
  string data;
  size_t bytes_local;
  unsigned_long_long val_local;
  QdfFixer *this_local;
  
  if (8 < bytes) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"fix-qdf::writeBinary called with too many bytes");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,bytes,'\0',(allocator<char> *)((long)&i + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  bytes_local = val;
  for (local_60 = bytes; local_60 != 0; local_60 = local_60 - 1) {
    puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_50);
    *puVar1 = (undefined1)bytes_local;
    bytes_local = bytes_local >> 8;
  }
  std::operator<<(this->out,local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void
QdfFixer::writeBinary(unsigned long long val, size_t bytes)
{
    if (bytes > sizeof(unsigned long long)) {
        throw std::logic_error("fix-qdf::writeBinary called with too many bytes");
    }
    std::string data(bytes, '\0');
    for (auto i = bytes; i > 0; --i) {
        data[i - 1] = static_cast<char>(val & 0xff); // i.e. val % 256
        val >>= 8;                                   // i.e. val = val / 256
    }
    out << data;
}